

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O1

void program(void)

{
  int size;
  char *msg;
  
  getSymbol();
  if (currentSymbol == -2) {
    msg = "no declaration found";
  }
  else {
    while (currentSymbol == 0x271) {
      getSymbol();
      includeStatement();
    }
    size = 0;
    while( true ) {
      while (currentSymbol == 0x26c) {
        getSymbol();
        functionPrototype();
      }
      if (1 < currentSymbol - 0x266U) break;
      size = declaration(size);
    }
    emitHeader(size);
    if (currentSymbol == 0x265) {
      do {
        getSymbol();
        functionDeclaration();
      } while (currentSymbol == 0x265);
      if (currentSymbol == -2) {
        return;
      }
      msg = "only function declarations allowed here";
    }
    else {
      msg = "at least one function required";
    }
  }
  mark(msg);
  exit(-1);
}

Assistant:

procedure
void program(void) {
	variable int varSize;
	varSize = 0;
    getSymbol();
    if (currentSymbol == SYMBOL_END) {
        mark("no declaration found");
        exit(-1);
    }

   while (currentSymbol == SYMBOL_HASHINCLUDE) {
		getSymbol();
		includeStatement();
	}

   while ((currentSymbol == SYMBOL_VAR) || (currentSymbol == SYMBOL_RECORD) || (currentSymbol == SYMBOL_PROT)) {
		if (currentSymbol == SYMBOL_PROT) {
			getSymbol();
			functionPrototype();
		} else {
			varSize = declaration(varSize);
		}
	}
	/* emit program header (for stack pointer initialization) */
	emitHeader(varSize);
	
	if (currentSymbol == SYMBOL_PROC) {
		getSymbol();
		functionDeclaration();
	} else {
		mark("at least one function required");
		exit(-1);
	}
	while (currentSymbol != SYMBOL_END) {
		if (currentSymbol == SYMBOL_PROC) {
            getSymbol();
			functionDeclaration();
        } else {
            mark("only function declarations allowed here");
            exit(-1);
        }
    }
}